

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O3

VRInputDevice *
MinVR::VRFakeTrackerDevice::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer *ppfVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  VRAnyCoreType VVar7;
  VRFakeTrackerDevice *this;
  float xyScale;
  float zScale;
  float rotScale;
  string style;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string devNameSpace;
  string rollEvent;
  string translateZEvent;
  string translateEvent;
  string rotateEvent;
  string toggleEvent;
  VRFloatArray defaultPos;
  float up [3];
  float local_344;
  float ctr [3];
  float local_334;
  VRMainInterface *local_330;
  vector<float,_std::allocator<float>_> local_328;
  vector<float,_std::allocator<float>_> local_310;
  vector<float,_std::allocator<float>_> local_2f8;
  VRFloatArray defaultUp;
  VRFloatArray defaultCtr;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string trackerName;
  VRVector3 startUp;
  VRVector3 startCtr;
  VRVector3 startPos;
  float pos [3];
  float local_7c;
  VRVector3 local_78;
  VRVector3 local_60;
  VRVector3 local_48;
  
  devNameSpace._M_dataplus._M_p = (pointer)&devNameSpace.field_2;
  pcVar4 = (nameSpace->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&devNameSpace,pcVar4,pcVar4 + nameSpace->_M_string_length);
  toggleEvent._M_dataplus._M_p = (pointer)&toggleEvent.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&toggleEvent,"TrackerName","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VVar7 = VRDataIndex::getValue(config,&toggleEvent,&local_110,true);
  (*(VVar7.datum)->_vptr_VRDatum[2])(&trackerName,VVar7.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)toggleEvent._M_dataplus._M_p != &toggleEvent.field_2) {
    operator_delete(toggleEvent._M_dataplus._M_p,toggleEvent.field_2._M_allocated_capacity + 1);
  }
  rotateEvent._M_dataplus._M_p = (pointer)&rotateEvent.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rotateEvent,"ToggleOnOffEvent","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VVar7 = VRDataIndex::getValue(config,&rotateEvent,&local_130,true);
  (*(VVar7.datum)->_vptr_VRDatum[2])(&toggleEvent,VVar7.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rotateEvent._M_dataplus._M_p != &rotateEvent.field_2) {
    operator_delete(rotateEvent._M_dataplus._M_p,rotateEvent.field_2._M_allocated_capacity + 1);
  }
  translateEvent._M_dataplus._M_p = (pointer)&translateEvent.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&translateEvent,"RotateEvent","");
  paVar2 = &translateZEvent.field_2;
  translateZEvent._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&translateZEvent,"Kbdr","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&rotateEvent,config,&translateEvent,&translateZEvent,&local_150,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)translateZEvent._M_dataplus._M_p != paVar2) {
    operator_delete(translateZEvent._M_dataplus._M_p,
                    translateZEvent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)translateEvent._M_dataplus._M_p != &translateEvent.field_2) {
    operator_delete(translateEvent._M_dataplus._M_p,translateEvent.field_2._M_allocated_capacity + 1
                   );
  }
  translateZEvent._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&translateZEvent,"TranslateEvent","");
  paVar1 = &rollEvent.field_2;
  rollEvent._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rollEvent,"Kbdw","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&translateEvent,config,&translateZEvent,&rollEvent,&local_170,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rollEvent._M_dataplus._M_p != paVar1) {
    operator_delete(rollEvent._M_dataplus._M_p,rollEvent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)translateZEvent._M_dataplus._M_p != paVar2) {
    operator_delete(translateZEvent._M_dataplus._M_p,
                    translateZEvent.field_2._M_allocated_capacity + 1);
  }
  rollEvent._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rollEvent,"TranslateZEvent","");
  paVar2 = &style.field_2;
  style._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&style,"Kbdz","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&translateZEvent,config,&rollEvent,&style,&local_190,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)style._M_dataplus._M_p != paVar2) {
    operator_delete(style._M_dataplus._M_p,style.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rollEvent._M_dataplus._M_p != &rollEvent.field_2) {
    operator_delete(rollEvent._M_dataplus._M_p,rollEvent.field_2._M_allocated_capacity + 1);
  }
  style._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&style,"RollEvent","");
  paVar1 = &local_460.field_2;
  local_460._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"Kbde","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&rollEvent,config,&style,&local_460,&local_1b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)style._M_dataplus._M_p != paVar2) {
    operator_delete(style._M_dataplus._M_p,style.field_2._M_allocated_capacity + 1);
  }
  style._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&style,"XYTranslationScale","");
  local_460._M_dataplus._M_p._0_4_ = 0x3f800000;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  xyScale = VRDataIndex::getValueWithDefault<float>
                      (config,&style,(float *)&local_460,&local_1d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)style._M_dataplus._M_p != paVar2) {
    operator_delete(style._M_dataplus._M_p,style.field_2._M_allocated_capacity + 1);
  }
  style._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&style,"ZTranslationScale","");
  local_460._M_dataplus._M_p._0_4_ = 0x3f800000;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  zScale = VRDataIndex::getValueWithDefault<float>
                     (config,&style,(float *)&local_460,&local_1f0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)style._M_dataplus._M_p != paVar2) {
    operator_delete(style._M_dataplus._M_p,style.field_2._M_allocated_capacity + 1);
  }
  style._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&style,"RotationScale","");
  local_460._M_dataplus._M_p._0_4_ = 0x40490fda;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  rotScale = VRDataIndex::getValueWithDefault<float>
                       (config,&style,(float *)&local_460,&local_210,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)style._M_dataplus._M_p != paVar2) {
    operator_delete(style._M_dataplus._M_p,style.field_2._M_allocated_capacity + 1);
  }
  style._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&style,"Sticky","");
  local_460._M_dataplus._M_p = local_460._M_dataplus._M_p & 0xffffffff00000000;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  iVar5 = VRDataIndex::getValueWithDefault<int>(config,&style,(int *)&local_460,&local_230,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)style._M_dataplus._M_p != paVar2) {
    operator_delete(style._M_dataplus._M_p,style.field_2._M_allocated_capacity + 1);
  }
  local_460._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"Style","");
  ppfVar3 = &defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppfVar3;
  local_330 = vrMain;
  std::__cxx11::string::_M_construct<char_const*>((string *)&defaultPos,"Looker","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&style,config,&local_460,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defaultPos,
             &local_250,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != ppfVar3) {
    operator_delete(defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  iVar6 = std::__cxx11::string::compare((char *)&style);
  pos[0] = 0.0;
  pos[1] = 0.0;
  pos[2] = -1.0;
  ctr[2] = 0.0;
  ctr[0] = 0.0;
  ctr[1] = 0.0;
  up[2] = 0.0;
  up[0] = 0.0;
  up[1] = 1.0;
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,std::allocator<float>> *)&defaultPos,pos,&local_7c,
             (allocator_type *)&local_460);
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,std::allocator<float>> *)&defaultCtr,ctr,&local_334,
             (allocator_type *)&local_460);
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,std::allocator<float>> *)&defaultUp,up,&local_344,
             (allocator_type *)&local_460);
  local_460._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"LookAtEye","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            (&local_2f8,config,&local_460,&defaultPos,&local_270,true);
  VRVector3::VRVector3(&startPos,&local_2f8);
  if (local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  local_460._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"LookAtCenter","");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            (&local_310,config,&local_460,&defaultCtr,&local_290,true);
  VRVector3::VRVector3(&startCtr,&local_310);
  if (local_310.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  local_460._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"LookAtUp","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,devNameSpace._M_dataplus._M_p,
             devNameSpace._M_dataplus._M_p + devNameSpace._M_string_length);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            (&local_328,config,&local_460,&defaultUp,&local_2b0,true);
  VRVector3::VRVector3(&startUp,&local_328);
  if (local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  this = (VRFakeTrackerDevice *)operator_new(0x268);
  VRVector3::VRVector3(&local_48,&startPos);
  VRVector3::VRVector3(&local_60,&startCtr);
  VRVector3::VRVector3(&local_78,&startUp);
  VRFakeTrackerDevice(this,&trackerName,&toggleEvent,&rotateEvent,&rollEvent,&translateEvent,
                      &translateZEvent,xyScale,zScale,rotScale,iVar5 != 0,iVar6 == 0,&local_48,
                      &local_60,&local_78);
  VRVector3::~VRVector3(&local_78);
  VRVector3::~VRVector3(&local_60);
  VRVector3::~VRVector3(&local_48);
  (**local_330->_vptr_VRMainInterface)(local_330,&this->super_VREventHandler);
  VRVector3::~VRVector3(&startUp);
  VRVector3::~VRVector3(&startCtr);
  VRVector3::~VRVector3(&startPos);
  if (defaultUp.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(defaultUp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)defaultUp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)defaultUp.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (defaultCtr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(defaultCtr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)defaultCtr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)defaultCtr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)defaultPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)style._M_dataplus._M_p != paVar2) {
    operator_delete(style._M_dataplus._M_p,style.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rollEvent._M_dataplus._M_p != &rollEvent.field_2) {
    operator_delete(rollEvent._M_dataplus._M_p,rollEvent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)translateZEvent._M_dataplus._M_p != &translateZEvent.field_2) {
    operator_delete(translateZEvent._M_dataplus._M_p,
                    translateZEvent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)translateEvent._M_dataplus._M_p != &translateEvent.field_2) {
    operator_delete(translateEvent._M_dataplus._M_p,translateEvent.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rotateEvent._M_dataplus._M_p != &rotateEvent.field_2) {
    operator_delete(rotateEvent._M_dataplus._M_p,rotateEvent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)toggleEvent._M_dataplus._M_p != &toggleEvent.field_2) {
    operator_delete(toggleEvent._M_dataplus._M_p,toggleEvent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)trackerName._M_dataplus._M_p != &trackerName.field_2) {
    operator_delete(trackerName._M_dataplus._M_p,trackerName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)devNameSpace._M_dataplus._M_p != &devNameSpace.field_2) {
    operator_delete(devNameSpace._M_dataplus._M_p,devNameSpace.field_2._M_allocated_capacity + 1);
  }
  return &this->super_VRInputDevice;
}

Assistant:

VRInputDevice*
VRFakeTrackerDevice::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {
    std::string devNameSpace = nameSpace;

    // Find and/or set all the default values.
    std::string trackerName = config->getValue("TrackerName", devNameSpace);
    std::string toggleEvent = config->getValue("ToggleOnOffEvent", devNameSpace);
    std::string rotateEvent = config->getValueWithDefault("RotateEvent",
                                                          std::string("Kbdr"),
                                                          devNameSpace);
    std::string translateEvent = config->getValueWithDefault("TranslateEvent",
                                                             std::string("Kbdw"),
                                                             devNameSpace);
    std::string translateZEvent = config->getValueWithDefault("TranslateZEvent",
                                                              std::string("Kbdz"),
                                                              devNameSpace);
    std::string rollEvent = config->getValueWithDefault("RollEvent",
                                                        std::string("Kbde"),
                                                        devNameSpace);
    float xyScale =
      config->getValueWithDefault("XYTranslationScale", 1.0f, devNameSpace);
    float zScale =
      config->getValueWithDefault("ZTranslationScale", 1.0f, devNameSpace);
    float rScale = config->getValueWithDefault("RotationScale",
                                               3.1415926f, devNameSpace);

    int sticky = config->getValueWithDefault("Sticky", 0, devNameSpace);
    std::string style = config->getValueWithDefault("Style",
                                                    std::string("Looker"),
                                                    devNameSpace);
    // We only have two styles, so we can use a boolean for it.  (Note that the
    // 'compare()' method returns a zero when the strings match.)
    bool seeker = !style.compare("Seeker");

    float pos[] = {0, 0, -1};
    float ctr[] = {0, 0, 0};
    float up[] = {0, 1, 0};
    VRFloatArray defaultPos (pos, pos + sizeof(pos) / sizeof(pos[0]));
    VRFloatArray defaultCtr (ctr, ctr + sizeof(ctr) / sizeof(ctr[0]));
    VRFloatArray defaultUp (up, up + sizeof(up) / sizeof(up[0]));
    VRVector3 startPos = config->getValueWithDefault("LookAtEye",
                                                     defaultPos, devNameSpace);
    VRVector3 startCtr = config->getValueWithDefault("LookAtCenter",
                                                     defaultCtr, devNameSpace);
    VRVector3 startUp = config->getValueWithDefault("LookAtUp",
                                                    defaultUp, devNameSpace);

    // Make a new object.
    VRFakeTrackerDevice *dev = new VRFakeTrackerDevice(trackerName,
                                                       toggleEvent,
                                                       rotateEvent,
                                                       rollEvent,
                                                       translateEvent,
                                                       translateZEvent,
                                                       xyScale,
                                                       zScale,
                                                       rScale,
                                                       sticky,
                                                       seeker,
                                                       startPos,
                                                       startCtr,
                                                       startUp);
    vrMain->addEventHandler(dev);

    return dev;
}